

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FFConsoleDemo.cpp
# Opt level: O0

bool __thiscall EventHandler::keyPressed(EventHandler *this,KeyEvent *arg)

{
  ostream *poVar1;
  JoystickManager *in_RSI;
  JoystickManager *in_RDI;
  EffectManager *unaff_retaddr;
  float in_stack_ffffffffffffffdc;
  EWhichJoystick eWhich;
  
  eWhich = *(EWhichJoystick *)
            &(in_RSI->_vecJoys).
             super__Vector_base<OIS::JoyStick_*,_std::allocator<OIS::JoyStick_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (eWhich == eNext) {
    Application::stop((Application *)
                      (in_RDI->_vecJoys).
                      super__Vector_base<OIS::JoyStick_*,_std::allocator<OIS::JoyStick_*>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  }
  else if (eWhich == 0x23) {
    Application::printHelp((Application *)in_RDI);
  }
  else if (eWhich == 0x39) {
    JoystickManager::changeAutoCenter(in_RDI,(EAutoCenterHow)in_stack_ffffffffffffffdc);
  }
  else if (eWhich == 200) {
    EffectManager::selectEffect((EffectManager *)this,arg._4_4_);
  }
  else if (eWhich == 0xc9) {
    JoystickManager::changeMasterGain(in_RDI,in_stack_ffffffffffffffdc);
  }
  else if (eWhich == 0xcb) {
    EffectManager::selectEffect((EffectManager *)this,arg._4_4_);
    JoystickManager::selectJoystick(in_RSI,eWhich);
    EffectManager::checkPlayableEffects(unaff_retaddr);
  }
  else if (eWhich == 0xcd) {
    EffectManager::selectEffect((EffectManager *)this,arg._4_4_);
    JoystickManager::selectJoystick(in_RSI,eWhich);
    EffectManager::checkPlayableEffects(unaff_retaddr);
  }
  else if (eWhich == 0xd0) {
    EffectManager::selectEffect((EffectManager *)this,arg._4_4_);
  }
  else if (eWhich == 0xd1) {
    JoystickManager::changeMasterGain(in_RDI,in_stack_ffffffffffffffdc);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Non mapped key: ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,*(int *)&(in_RSI->_vecJoys).
                                        super__Vector_base<OIS::JoyStick_*,_std::allocator<OIS::JoyStick_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return true;
}

Assistant:

bool EventHandler::keyPressed(const KeyEvent& arg)
{
	switch(arg.key)
	{
		// Quit.
		case KC_ESCAPE:
			_pApplication->stop();
			break;

		// Help.
		case KC_H:
			_pApplication->printHelp();
			break;

		// Change current joystick.
		case KC_RIGHT:
			_pEffectMgr->selectEffect(EffectManager::eNone);
			_pJoystickMgr->selectJoystick(JoystickManager::eNext);
			_pEffectMgr->checkPlayableEffects();
			break;
		case KC_LEFT:
			_pEffectMgr->selectEffect(EffectManager::eNone);
			_pJoystickMgr->selectJoystick(JoystickManager::ePrevious);
			_pEffectMgr->checkPlayableEffects();
			break;

		// Change current effect.
		case KC_UP:
			_pEffectMgr->selectEffect(EffectManager::eNext);
			break;
		case KC_DOWN:
			_pEffectMgr->selectEffect(EffectManager::ePrevious);
			break;

		// Change current master gain.
		case KC_PGUP:
			_pJoystickMgr->changeMasterGain(5.0); // Percent
			break;
		case KC_PGDOWN:
			_pJoystickMgr->changeMasterGain(-5.0); // Percent
			break;

		// Toggle auto-center mode.
		case KC_SPACE:
			_pJoystickMgr->changeAutoCenter();
			break;

		default:
			cout << "Non mapped key: " << arg.key << endl;
	}
	return true;
}